

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O2

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  string *dst;
  long lVar1;
  Comparator *pCVar2;
  uint __line;
  char cVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t n;
  char *__assertion;
  size_type __n;
  size_t sVar8;
  size_type __n_00;
  long in_FS_OFFSET;
  Slice local_58;
  Slice last_key_piece;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  last_key_piece.data_ = (this->last_key_)._M_dataplus._M_p;
  last_key_piece.size_ = (this->last_key_)._M_string_length;
  if (this->finished_ == true) {
    __assertion = "!finished_";
    __line = 0x4a;
  }
  else {
    iVar6 = this->counter_;
    iVar7 = this->options_->block_restart_interval;
    if (iVar7 < iVar6) {
      __assertion = "counter_ <= options_->block_restart_interval";
      __line = 0x4b;
    }
    else {
      if ((this->buffer_)._M_string_length != 0) {
        pCVar2 = this->options_->comparator;
        iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,key,&last_key_piece);
        if (iVar6 < 1) {
          __assertion = "buffer_.empty() || options_->comparator->Compare(key, last_key_piece) > 0";
          __line = 0x4d;
          goto LAB_005600e7;
        }
        iVar6 = this->counter_;
        iVar7 = this->options_->block_restart_interval;
      }
      dst = &this->buffer_;
      if (iVar6 < iVar7) {
        sVar8 = last_key_piece.size_;
        if (key->size_ < last_key_piece.size_) {
          sVar8 = key->size_;
        }
        for (n = 0; __n_00 = sVar8, sVar8 != n; n = n + 1) {
          cVar3 = Slice::operator[](&last_key_piece,n);
          cVar4 = Slice::operator[](key,n);
          __n_00 = n;
          if (cVar3 != cVar4) break;
        }
      }
      else {
        local_58.data_ =
             (char *)CONCAT44(local_58.data_._4_4_,(int)(this->buffer_)._M_string_length);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->restarts_,(uint *)&local_58);
        this->counter_ = 0;
        __n_00 = 0;
      }
      __n = key->size_ - __n_00;
      PutVarint32(dst,(uint32_t)__n_00);
      PutVarint32(dst,(uint32_t)__n);
      PutVarint32(dst,(uint32_t)value->size_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (dst,key->data_ + __n_00,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (dst,value->data_,value->size_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&this->last_key_,__n_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->last_key_,key->data_ + __n_00,__n);
      local_58.data_ = (this->last_key_)._M_dataplus._M_p;
      local_58.size_ = (this->last_key_)._M_string_length;
      bVar5 = leveldb::operator==(&local_58,key);
      if (bVar5) {
        this->counter_ = this->counter_ + 1;
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return;
      }
      __assertion = "Slice(last_key_) == key";
      __line = 0x68;
    }
  }
LAB_005600e7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block_builder.cc"
                ,__line,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back(buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, shared);
  PutVarint32(&buffer_, non_shared);
  PutVarint32(&buffer_, value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}